

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O1

Vec4 __thiscall
vkt::sr::anon_unknown_0::getDerivateThreshold
          (anon_unknown_0 *this,Precision precision,Vec4 *valueMin,Vec4 *valueMax,
          Vec4 *expectedDerivate)

{
  long lVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  Vec4 VVar7;
  int aiStack_78 [2];
  IVec4 numAccurateBits;
  Vector<int,_4> res_4;
  UVec4 derivExp;
  UVec4 maxValueExp;
  Vector<int,_4> res_3;
  UVec4 numBitsLost;
  
  iVar4 = 0;
  if (precision < PRECISION_LAST) {
    iVar4 = *(int *)(&DAT_00b179d0 + (ulong)precision * 4);
  }
  res_4.m_data[2] = (uint)expectedDerivate->m_data[0] >> 0x17 & 0xff;
  res_4.m_data[3] = (uint)expectedDerivate->m_data[1] >> 0x17 & 0xff;
  derivExp.m_data[0] = (uint)expectedDerivate->m_data[2] >> 0x17 & 0xff;
  derivExp.m_data[1] = (uint)expectedDerivate->m_data[3] >> 0x17 & 0xff;
  numAccurateBits.m_data._0_8_ =
       CONCAT44((uint)valueMin->m_data[3] >> 0x17,(uint)valueMin->m_data[2] >> 0x17) & 0xff000000ff;
  numAccurateBits.m_data._8_8_ =
       CONCAT44((uint)valueMax->m_data[1] >> 0x17,(uint)valueMax->m_data[0] >> 0x17) & 0xff000000ff;
  res_4.m_data._0_8_ =
       CONCAT44((uint)valueMax->m_data[3] >> 0x17,(uint)valueMax->m_data[2] >> 0x17) & 0xff000000ff;
  derivExp.m_data[2] = 0;
  derivExp.m_data[3] = 0;
  maxValueExp.m_data[0] = 0;
  maxValueExp.m_data[1] = 0;
  lVar1 = 0;
  do {
    uVar3 = numAccurateBits.m_data[lVar1 + 2];
    if ((uint)numAccurateBits.m_data[lVar1 + 2] < (uint)numAccurateBits.m_data[lVar1 + -2]) {
      uVar3 = numAccurateBits.m_data[lVar1 + -2];
    }
    derivExp.m_data[lVar1 + 2] = uVar3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  numAccurateBits.m_data[0] = 0;
  numAccurateBits.m_data[1] = 0;
  lVar1 = 0;
  do {
    uVar3 = res_4.m_data[lVar1 + 2];
    if (derivExp.m_data[lVar1 + 2] < (uint)res_4.m_data[lVar1 + 2]) {
      uVar3 = derivExp.m_data[lVar1 + 2];
    }
    numAccurateBits.m_data[lVar1 + -2] = uVar3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  res_3.m_data[2] = 0;
  res_3.m_data[3] = 0;
  numBitsLost.m_data[0] = 0;
  numBitsLost.m_data[1] = 0;
  lVar1 = 0;
  do {
    res_3.m_data[lVar1 + 2] = derivExp.m_data[lVar1 + 2] - numAccurateBits.m_data[lVar1 + -2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  maxValueExp.m_data[2] = 0;
  maxValueExp.m_data[3] = 0;
  res_3.m_data[0] = 0;
  res_3.m_data[1] = 0;
  lVar1 = 0;
  do {
    maxValueExp.m_data[lVar1 + 2] = iVar4 - res_3.m_data[lVar1 + 2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  numAccurateBits.m_data[2] = 0;
  numAccurateBits.m_data[3] = 0;
  res_4.m_data[0] = 0;
  res_4.m_data[1] = 0;
  lVar1 = 0;
  do {
    numAccurateBits.m_data[lVar1 + 2] = maxValueExp.m_data[lVar1 + 2] - 3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  numBitsLost.m_data[2] = 0;
  numBitsLost.m_data[3] = 0;
  numAccurateBits.m_data[0] = 0;
  numAccurateBits.m_data[1] = 0;
  lVar1 = 0;
  do {
    uVar3 = numBitsLost.m_data[lVar1 + 2];
    if ((int)numBitsLost.m_data[lVar1 + 2] < numAccurateBits.m_data[lVar1 + 2]) {
      uVar3 = numAccurateBits.m_data[lVar1 + 2];
    }
    numAccurateBits.m_data[lVar1 + -2] = uVar3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  fVar5 = (float)((uint)expectedDerivate->m_data[0] & 0x7f800000);
  fVar6 = fVar5;
  if (((uint)expectedDerivate->m_data[0] & 0x7fffff) != 0) {
    fVar6 = 1.1754944e-38;
  }
  if (fVar5 != 0.0) {
    fVar6 = fVar5;
  }
  VVar7.m_data[0] = (float)((uint)fVar6 ^ 0x7fffff) - fVar6;
  fVar5 = (float)((uint)expectedDerivate->m_data[1] & 0x7f800000);
  fVar6 = fVar5;
  if (((uint)expectedDerivate->m_data[1] & 0x7fffff) != 0) {
    fVar6 = 1.1754944e-38;
  }
  if (fVar5 != 0.0) {
    fVar6 = fVar5;
  }
  fVar2 = (float)((uint)expectedDerivate->m_data[2] & 0x7f800000);
  fVar5 = fVar2;
  if (((uint)expectedDerivate->m_data[2] & 0x7fffff) != 0) {
    fVar5 = 1.1754944e-38;
  }
  if (fVar2 != 0.0) {
    fVar5 = fVar2;
  }
  VVar7.m_data[2] = (float)((uint)fVar6 ^ 0x7fffff) - fVar6;
  fVar2 = (float)((uint)expectedDerivate->m_data[3] & 0x7f800000);
  fVar6 = 1.1754944e-38;
  if (((uint)expectedDerivate->m_data[3] & 0x7fffff) == 0) {
    fVar6 = fVar2;
  }
  if (fVar2 != 0.0) {
    fVar6 = fVar2;
  }
  *(float *)this = VVar7.m_data[0];
  *(float *)(this + 4) = VVar7.m_data[2];
  *(float *)(this + 8) =
       (float)(((0x7fffffU >> (0x17U - (char)numAccurateBits.m_data[0] & 0x1f)) <<
                (0x17U - (char)numAccurateBits.m_data[0] & 0x1f) | (uint)fVar5) ^ 0x7fffff) - fVar5;
  *(float *)(this + 0xc) =
       (float)(((0x7fffffU >> (0x17U - (char)numAccurateBits.m_data[1] & 0x1f)) <<
                (0x17U - (char)numAccurateBits.m_data[1] & 0x1f) | (uint)fVar6) ^ 0x7fffff) - fVar6;
  VVar7.m_data[1] = 0.0;
  VVar7.m_data[3] = 0.0;
  return (Vec4)VVar7.m_data;
}

Assistant:

static inline tcu::Vec4 getDerivateThreshold (const glu::Precision precision, const tcu::Vec4& valueMin, const tcu::Vec4& valueMax, const tcu::Vec4& expectedDerivate)
{
	const int			baseBits		= getNumMantissaBits(precision);
	const tcu::UVec4	derivExp		= getCompExpBits(expectedDerivate);
	const tcu::UVec4	maxValueExp		= max(getCompExpBits(valueMin), getCompExpBits(valueMax));
	const tcu::UVec4	numBitsLost		= maxValueExp - min(maxValueExp, derivExp);
	const tcu::IVec4	numAccurateBits	= max(baseBits - numBitsLost.asInt() - (int)INTERPOLATION_LOST_BITS, tcu::IVec4(0));

	return tcu::Vec4(computeFloatingPointError(expectedDerivate[0], numAccurateBits[0]),
					 computeFloatingPointError(expectedDerivate[1], numAccurateBits[1]),
					 computeFloatingPointError(expectedDerivate[2], numAccurateBits[2]),
					 computeFloatingPointError(expectedDerivate[3], numAccurateBits[3]));
}